

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

void Abc_NtkSecSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConfLimit,int nInsLimit,int nFrames)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pMiter;
  char *pcVar3;
  char *__s;
  
  pAVar2 = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Miter computation has failed.";
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pAVar2);
    if (iVar1 == 1) {
      Abc_NtkDelete(pAVar2);
      pcVar3 = "Networks are equivalent after structural hashing.";
    }
    else if (iVar1 == 0) {
      Abc_NtkDelete(pAVar2);
      pcVar3 = "Networks are NOT EQUIVALENT after structural hashing.";
    }
    else {
      pMiter = Abc_NtkFrames(pAVar2,nFrames,1,0);
      Abc_NtkDelete(pAVar2);
      if (pMiter == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Frames computation has failed.";
      }
      else {
        iVar1 = Abc_NtkMiterIsConstant(pMiter);
        if (iVar1 == 1) {
          Abc_NtkDelete(pMiter);
          pcVar3 = "Networks are equivalent after framing.";
        }
        else if (iVar1 == 0) {
          Abc_NtkDelete(pMiter);
          pcVar3 = "Networks are NOT EQUIVALENT after framing.";
        }
        else {
          pAVar2 = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
          Abc_NtkDelete(pMiter);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            iVar1 = Abc_NtkMiterSat(pAVar2,(long)nConfLimit,(long)nInsLimit,0,(ABC_INT64_T *)0x0,
                                    (ABC_INT64_T *)0x0);
            pcVar3 = "Networks are equivalent after SAT.";
            if (iVar1 == 0) {
              pcVar3 = "Networks are NOT EQUIVALENT after SAT.";
            }
            __s = "Networks are undecided (SAT solver timed out).";
            if (iVar1 != -1) {
              __s = pcVar3;
            }
            puts(__s);
            Abc_NtkDelete(pAVar2);
            return;
          }
          pcVar3 = "Renoding for CNF has failed.";
        }
      }
    }
  }
  puts(pcVar3);
  return;
}

Assistant:

void Abc_NtkSecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit, int nFrames )
{
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pFrames;
    Abc_Ntk_t * pCnf;
    int RetValue;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        return;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are equivalent after structural hashing.\n" );
        return;
    }

    // create the timeframes
    pFrames = Abc_NtkFrames( pMiter, nFrames, 1, 0 );
    Abc_NtkDelete( pMiter );
    if ( pFrames == NULL )
    {
        printf( "Frames computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pFrames );
    if ( RetValue == 0 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are NOT EQUIVALENT after framing.\n" );
        return;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are equivalent after framing.\n" );
        return;
    }

    // convert the miter into a CNF
    pCnf = Abc_NtkMulti( pFrames, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pFrames );
    if ( pCnf == NULL )
    {
        printf( "Renoding for CNF has failed.\n" );
        return;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, 0, NULL, NULL );
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out).\n" );
    else if ( RetValue == 0 )
        printf( "Networks are NOT EQUIVALENT after SAT.\n" );
    else
        printf( "Networks are equivalent after SAT.\n" );
    Abc_NtkDelete( pCnf );
}